

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O3

void __thiscall duckdb::TaskScheduler::TaskScheduler(TaskScheduler *this,DatabaseInstance *db)

{
  bool enable;
  _Head_base<0UL,_duckdb::ConcurrentQueue_*,_false> this_00;
  pointer *__ptr;
  
  this->db = db;
  this_00._M_head_impl = (ConcurrentQueue *)operator_new(0x290);
  switchD_012e3010::default(this_00._M_head_impl,0,0x290);
  duckdb_moodycamel::
  ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  ::ConcurrentQueue((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                     *)this_00._M_head_impl,0xc0);
  (((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
     *)&(this_00._M_head_impl)->semaphore)->producerListTail)._M_b._M_p = (__pointer_type)0x0;
  sem_init((sem_t *)((long)&(this_00._M_head_impl)->semaphore + 8),0,0);
  (this->queue).
  super_unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConcurrentQueue_*,_std::default_delete<duckdb::ConcurrentQueue>_>.
  super__Head_base<0UL,_duckdb::ConcurrentQueue_*,_false>._M_head_impl = this_00._M_head_impl;
  (this->thread_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->thread_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->thread_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->thread_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->thread_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->threads).
  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).
  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads).
  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->markers).
  super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->markers).
  super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->markers).
  super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocator_flush_threshold).super___atomic_base<unsigned_long>._M_i =
       (db->config).options.allocator_flush_threshold;
  enable = (db->config).options.allocator_background_threads;
  (this->allocator_background_threads)._M_base._M_i = enable;
  this->requested_thread_count = (__atomic_base<int>)0x0;
  this->current_thread_count = (__atomic_base<int>)0x1;
  LOCK();
  (this->allocator_background_threads)._M_base._M_i = enable;
  UNLOCK();
  Allocator::SetBackgroundThreads(enable);
  return;
}

Assistant:

TaskScheduler::TaskScheduler(DatabaseInstance &db)
    : db(db), queue(make_uniq<ConcurrentQueue>()),
      allocator_flush_threshold(db.config.options.allocator_flush_threshold),
      allocator_background_threads(db.config.options.allocator_background_threads), requested_thread_count(0),
      current_thread_count(1) {
	SetAllocatorBackgroundThreads(db.config.options.allocator_background_threads);
}